

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O1

bool __thiscall zmq::stream_engine_base_t::restart_input(stream_engine_base_t *this)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  code *pcVar4;
  uchar *puVar5;
  bool bVar6;
  size_t processed;
  ulong local_30;
  
  if (this->_input_stopped == false) {
    restart_input();
  }
  if (this->_session == (session_base_t *)0x0) {
    restart_input();
  }
  if (this->_decoder == (i_decoder *)0x0) {
    restart_input();
  }
  pcVar4 = (code *)this->_process_msg;
  puVar5 = (this->_options).routing_id + *(long *)&this->field_0x560 + -0x29;
  if (((ulong)pcVar4 & 1) != 0) {
    pcVar4 = *(code **)(pcVar4 + *(long *)puVar5 + -1);
  }
  iVar1 = (*this->_decoder->_vptr_i_decoder[5])();
  iVar1 = (*pcVar4)(puVar5,iVar1);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) goto LAB_001f60e1;
  }
  else {
    sVar3 = this->_insize;
    if (sVar3 == 0) {
      bVar6 = false;
    }
    else {
      do {
        local_30 = 0;
        iVar1 = (*this->_decoder->_vptr_i_decoder[4])(this->_decoder,this->_inpos,sVar3,&local_30);
        if (this->_insize < local_30) {
          restart_input();
        }
        this->_inpos = this->_inpos + local_30;
        this->_insize = this->_insize - local_30;
        if (iVar1 + 1U < 2) {
          bVar6 = true;
        }
        else {
          pcVar4 = (code *)this->_process_msg;
          puVar5 = (this->_options).routing_id + *(long *)&this->field_0x560 + -0x29;
          if (((ulong)pcVar4 & 1) != 0) {
            pcVar4 = *(code **)(pcVar4 + *(long *)puVar5 + -1);
          }
          iVar1 = (*this->_decoder->_vptr_i_decoder[5])();
          iVar1 = (*pcVar4)(puVar5,iVar1);
          bVar6 = iVar1 == -1;
        }
      } while ((!bVar6) && (sVar3 = this->_insize, sVar3 != 0));
      bVar6 = iVar1 == -1;
    }
    if ((!bVar6) || (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      if (this->_io_error == true) {
        (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,1);
        return false;
      }
      if (!bVar6) {
        this->_input_stopped = false;
        io_object_t::set_pollin(&this->super_io_object_t,this->_handle);
        session_base_t::flush(this->_session);
        bVar6 = in_event_internal(this);
        if (bVar6) {
          return true;
        }
        return false;
      }
LAB_001f60e1:
      (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,0);
      return false;
    }
  }
  session_base_t::flush(this->_session);
  return true;
}

Assistant:

bool zmq::stream_engine_base_t::restart_input ()
{
    zmq_assert (_input_stopped);
    zmq_assert (_session != NULL);
    zmq_assert (_decoder != NULL);

    int rc = (this->*_process_msg) (_decoder->msg ());
    if (rc == -1) {
        if (errno == EAGAIN)
            _session->flush ();
        else {
            error (protocol_error);
            return false;
        }
        return true;
    }

    while (_insize > 0) {
        size_t processed = 0;
        rc = _decoder->decode (_inpos, _insize, processed);
        zmq_assert (processed <= _insize);
        _inpos += processed;
        _insize -= processed;
        if (rc == 0 || rc == -1)
            break;
        rc = (this->*_process_msg) (_decoder->msg ());
        if (rc == -1)
            break;
    }

    if (rc == -1 && errno == EAGAIN)
        _session->flush ();
    else if (_io_error) {
        error (connection_error);
        return false;
    } else if (rc == -1) {
        error (protocol_error);
        return false;
    }

    else {
        _input_stopped = false;
        set_pollin ();
        _session->flush ();

        //  Speculative read.
        if (!in_event_internal ())
            return false;
    }

    return true;
}